

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O0

InputStack * __thiscall
miniscript::internal::InputStack::SetAvailable(InputStack *this,Availability avail)

{
  long lVar1;
  unsigned_long uVar2;
  Availability in_ESI;
  InputStack *in_RDI;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->available = in_ESI;
  if (in_ESI == NO) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::clear(in_stack_ffffffffffffffd8);
    uVar2 = std::numeric_limits<unsigned_long>::max();
    in_RDI->size = uVar2;
    in_RDI->has_sig = false;
    in_RDI->malleable = false;
    in_RDI->non_canon = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

InputStack& InputStack::SetAvailable(Availability avail) {
    available = avail;
    if (avail == Availability::NO) {
        stack.clear();
        size = std::numeric_limits<size_t>::max();
        has_sig = false;
        malleable = false;
        non_canon = false;
    }
    return *this;
}